

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

iterator __thiscall
estl::vector_s<Rect,6ul>::emplace<unsigned_int,unsigned_int>
          (vector_s<Rect,6ul> *this,const_iterator pos,uint *args,uint *args_1)

{
  ulong uVar1;
  uint uVar2;
  range_error *this_00;
  
  uVar1 = *(long *)this + 1;
  if (uVar1 < 7) {
    shift_right<Rect*>(this,pos,(Rect *)(*(long *)this * 8 + *(long *)(this + 0x38)),1);
    uVar2 = *args_1;
    pos->width_ = *args;
    pos->height_ = uVar2;
    *(ulong *)this = uVar1;
    return pos;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"cas::vector_s emplace beyond capacity.");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

iterator emplace( const_iterator pos, Args&&... args )
    {
        const auto new_size = size() + 1u;
        if (new_size > capacity()) {
            ESTL_THROW (std::range_error, "cas::vector_s emplace beyond capacity.");
            return end();
        }

        iterator ipos = const_cast<iterator>(pos);
        shift_right(ipos, end(), 1u);
        new (static_cast<pointer>(ipos)) T(std::forward<Args>(args)...);
        size_ = new_size;
        return ipos;
    }